

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec-ops.c
# Opt level: O2

int main(int argc,char **argv)

{
  char *name;
  axbStatus_t aVar1;
  undefined8 uVar2;
  char *name_00;
  axbHandle_s *axbHandle;
  axbOpBackend_s *op_backend;
  axbMemBackend_s *mem_backend;
  
  if (argc < 2) {
    fwrite("Missing argument: MemoryBackend\n",0x20,1,_stderr);
LAB_00104fe6:
    aVar1 = 1;
  }
  else {
    name = argv[1];
    name_00 = name;
    if (argc != 2) {
      name_00 = argv[2];
    }
    puts("Initializing libaxb...");
    aVar1 = axbInit(&axbHandle);
    if (aVar1 == 0) {
      aVar1 = axbMemBackendGetByName(axbHandle,&mem_backend,name);
      if (aVar1 == 0) {
        if (mem_backend != (axbMemBackend_s *)0x0) {
          printf("Using memory backend %s\n",name);
          aVar1 = axbOpBackendGetByName(axbHandle,&op_backend,name_00);
          if (aVar1 != 0) {
            uVar2 = 0x108;
            goto LAB_0010504c;
          }
          if (op_backend != (axbOpBackend_s *)0x0) {
            printf("Using op backend %s\n",name_00);
            setup(axbHandle,mem_backend,op_backend);
            puts("Shutting down libaxb...");
            aVar1 = axbFinalize(axbHandle);
            if (aVar1 == 0) {
              puts("Completed successfully");
              return 0;
            }
            fprintf(_stderr,"Failure in line %d in file %s\n",0x113,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/tests/src/vec-ops.c"
                   );
            return aVar1;
          }
        }
        fprintf(_stderr,"ERROR: Cannot find memory backend %s\n",name);
        goto LAB_00104fe6;
      }
      uVar2 = 0x100;
    }
    else {
      uVar2 = 0xfd;
    }
LAB_0010504c:
    fprintf(_stderr,"Failure in line %d in file %s\n",uVar2,
            "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/tests/src/vec-ops.c"
           );
  }
  return aVar1;
}

Assistant:

int main(int argc, char **argv)
{
  struct axbHandle_s *axbHandle;
  const char *mem_backend_name = argv[1];
  const char *op_backend_name = argv[2];

  if (argc < 2) {
    fprintf(stderr, "Missing argument: MemoryBackend\n");
    return EXIT_FAILURE;
  }
  else if (argc == 2) { // mem backend equals op backend
    op_backend_name = argv[1];
  }

  printf("Initializing libaxb...\n");
  AXB_ERR_CHECK(axbInit(&axbHandle));

  struct axbMemBackend_s *mem_backend;
  AXB_ERR_CHECK(axbMemBackendGetByName(axbHandle, &mem_backend, mem_backend_name));
  if (!mem_backend) {
    fprintf(stderr, "ERROR: Cannot find memory backend %s\n", mem_backend_name);
    return EXIT_FAILURE;
  }
  printf("Using memory backend %s\n", mem_backend_name);

  struct axbOpBackend_s *op_backend;
  AXB_ERR_CHECK(axbOpBackendGetByName(axbHandle, &op_backend, op_backend_name));
  if (!op_backend) {
    fprintf(stderr, "ERROR: Cannot find memory backend %s\n", mem_backend_name);
    return EXIT_FAILURE;
  }
  printf("Using op backend %s\n", op_backend_name);

  setup(axbHandle, mem_backend, op_backend);


  printf("Shutting down libaxb...\n");
  AXB_ERR_CHECK(axbFinalize(axbHandle));

  printf("Completed successfully\n");

  return EXIT_SUCCESS;
}